

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# image_function.cpp
# Opt level: O0

void Image_Function::ConvertToRgb
               (Image *in,uint32_t startXIn,uint32_t startYIn,Image *out,uint32_t startXOut,
               uint32_t startYOut,uint32_t width,uint32_t height)

{
  uint8_t uVar1;
  uint32_t uVar2;
  uint32_t uVar3;
  uchar *puVar4;
  uchar *puVar5;
  uchar *puVar6;
  byte *pbVar7;
  ImageTemplate<unsigned_char> *in_RCX;
  int in_EDX;
  uint in_ESI;
  ImageTemplate<unsigned_char> *in_RDI;
  int in_R8D;
  int in_R9D;
  uint32_t in_stack_00000008;
  uint32_t in_stack_0000000c;
  int in_stack_00000010;
  undefined4 in_stack_00000014;
  uint8_t *outXEnd;
  uint8_t *outX;
  uint8_t *inX;
  uint8_t *outYEnd;
  uint8_t *outY;
  uint8_t *inY;
  uint8_t colorCount;
  uint32_t rowSizeOut;
  uint32_t rowSizeIn;
  ImageTemplate<unsigned_char> *in_stack_ffffffffffffffa0;
  undefined8 in_stack_ffffffffffffffa8;
  ImageTemplate<unsigned_char> *in_stack_ffffffffffffffb0;
  undefined8 in_stack_ffffffffffffffb8;
  ImageTemplate<unsigned_char> *in_stack_ffffffffffffffc0;
  uchar *puVar8;
  byte *local_38;
  uint32_t in_stack_ffffffffffffffd0;
  uint32_t in_stack_ffffffffffffffd8;
  
  ParameterValidation<PenguinV_Image::ImageTemplate<unsigned_char>>
            (in_stack_ffffffffffffffc0,(uint32_t)((ulong)in_stack_ffffffffffffffb8 >> 0x20),
             (uint32_t)in_stack_ffffffffffffffb8,in_stack_ffffffffffffffb0,
             (uint32_t)((ulong)in_stack_ffffffffffffffa8 >> 0x20),
             (uint32_t)in_stack_ffffffffffffffa8,in_stack_ffffffffffffffd0,in_stack_ffffffffffffffd8
            );
  VerifyRGBImage<PenguinV_Image::ImageTemplate<unsigned_char>>(in_stack_ffffffffffffffa0);
  uVar1 = PenguinV_Image::ImageTemplate<unsigned_char>::colorCount(in_RDI);
  if (uVar1 == '\x03') {
    Copy((Image *)outX,outXEnd._4_4_,(uint32_t)outXEnd,
         (Image *)CONCAT44(in_stack_00000014,in_stack_00000010),in_stack_0000000c,in_stack_00000008,
         (uint32_t)outYEnd,(uint32_t)outY);
  }
  else {
    uVar2 = PenguinV_Image::ImageTemplate<unsigned_char>::rowSize(in_RDI);
    uVar3 = PenguinV_Image::ImageTemplate<unsigned_char>::rowSize(in_RCX);
    puVar4 = PenguinV_Image::ImageTemplate<unsigned_char>::data(in_RDI);
    local_38 = puVar4 + (ulong)in_ESI + (ulong)(in_EDX * uVar2);
    puVar5 = PenguinV_Image::ImageTemplate<unsigned_char>::data(in_RCX);
    puVar5 = puVar5 + (ulong)(uint)(in_R8D * 3) + (ulong)(in_R9D * uVar3);
    puVar4 = puVar5 + in_stack_00000010 * uVar3;
    while (puVar5 != puVar4) {
      puVar6 = puVar5 + in_stack_00000008 * 3;
      pbVar7 = local_38;
      puVar8 = puVar5;
      for (; puVar5 != puVar6; puVar5 = puVar5 + 3) {
        memset(puVar5,(uint)*pbVar7,3);
        pbVar7 = pbVar7 + 1;
      }
      local_38 = local_38 + uVar2;
      puVar5 = puVar8 + uVar3;
    }
  }
  return;
}

Assistant:

void ConvertToRgb( const Image & in, uint32_t startXIn, uint32_t startYIn, Image & out, uint32_t startXOut, uint32_t startYOut,
                       uint32_t width, uint32_t height )
    {
        ParameterValidation( in, startXIn, startYIn, out, startXOut, startYOut, width, height );
        VerifyRGBImage     ( out );

        if( in.colorCount() == RGB ) {
            Copy( in, startXIn, startYIn, out, startXOut, startYOut, width, height );
            return;
        }

        const uint32_t rowSizeIn  = in.rowSize();
        const uint32_t rowSizeOut = out.rowSize();

        const uint8_t colorCount = RGB;

        const uint8_t * inY  = in.data()  + startYIn  * rowSizeIn  + startXIn;
        uint8_t       * outY = out.data() + startYOut * rowSizeOut + startXOut * colorCount;

        const uint8_t * outYEnd = outY + height * rowSizeOut;

        width = width * colorCount;

        for( ; outY != outYEnd; outY += rowSizeOut, inY += rowSizeIn ) {
            const uint8_t * inX  = inY;
            uint8_t       * outX = outY;

            const uint8_t * outXEnd = outX + width;

            for( ; outX != outXEnd; outX += colorCount, ++inX )
                memset( outX, (*inX), sizeof( uint8_t ) * colorCount );
        }
    }